

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

Collator * icu_63::Collator::makeInstance(Locale *desiredLocale,UErrorCode *status)

{
  UBool UVar1;
  CollationCacheEntry *entry_00;
  RuleBasedCollator *this;
  UErrorCode *size;
  RuleBasedCollator *local_58;
  Collator *result;
  CollationCacheEntry *entry;
  UErrorCode *status_local;
  Locale *desiredLocale_local;
  
  size = status;
  entry_00 = CollationLoader::loadTailoring(desiredLocale,status);
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    this = (RuleBasedCollator *)UMemory::operator_new((UMemory *)0x110,(size_t)size);
    local_58 = (RuleBasedCollator *)0x0;
    if (this != (RuleBasedCollator *)0x0) {
      RuleBasedCollator::RuleBasedCollator(this,entry_00);
      local_58 = this;
    }
    if (local_58 != (RuleBasedCollator *)0x0) {
      SharedObject::removeRef(&entry_00->super_SharedObject);
      return &local_58->super_Collator;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  if (entry_00 != (CollationCacheEntry *)0x0) {
    SharedObject::removeRef(&entry_00->super_SharedObject);
  }
  return (Collator *)0x0;
}

Assistant:

Collator* Collator::makeInstance(const Locale&  desiredLocale, UErrorCode& status) {
    const CollationCacheEntry *entry = CollationLoader::loadTailoring(desiredLocale, status);
    if (U_SUCCESS(status)) {
        Collator *result = new RuleBasedCollator(entry);
        if (result != NULL) {
            // Both the unified cache's get() and the RBC constructor
            // did addRef(). Undo one of them.
            entry->removeRef();
            return result;
        }
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    if (entry != NULL) {
        // Undo the addRef() from the cache.get().
        entry->removeRef();
    }
    return NULL;
}